

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CInterfaceIOWrapper.cpp
# Opt level: O2

IOStream * __thiscall Assimp::CIOSystemWrapper::Open(CIOSystemWrapper *this,char *pFile,char *pMode)

{
  aiFile *paVar1;
  IOStream *pIVar2;
  
  paVar1 = (*this->mFileSystem->OpenProc)(this->mFileSystem,pFile,pMode);
  if (paVar1 == (aiFile *)0x0) {
    pIVar2 = (IOStream *)0x0;
  }
  else {
    pIVar2 = (IOStream *)Intern::AllocateFromAssimpHeap::operator_new(0x18);
    pIVar2->_vptr_IOStream = (_func_int **)&PTR__CIOStreamWrapper_0082d1e0;
    pIVar2[1]._vptr_IOStream = (_func_int **)paVar1;
    pIVar2[2]._vptr_IOStream = (_func_int **)this;
  }
  return pIVar2;
}

Assistant:

IOStream* CIOSystemWrapper::Open(const char* pFile,const char* pMode) {
    aiFile* p = mFileSystem->OpenProc(mFileSystem,pFile,pMode);
    if (!p) {
        return NULL;
    }
    return new CIOStreamWrapper(p, this);
}